

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

With * sqlite3WithAdd(Parse *pParse,With *pWith,Token *pName,ExprList *pArglist,Select *pQuery)

{
  sqlite3 *db;
  int iVar1;
  char *zLeft;
  With *pWVar2;
  Cte *pCVar3;
  long lVar4;
  
  db = pParse->db;
  zLeft = sqlite3NameFromToken(db,pName);
  if (pWith == (With *)0x0 || zLeft == (char *)0x0) {
    if (pWith == (With *)0x0) {
      pWVar2 = (With *)sqlite3DbMallocZero(db,0x30);
      goto LAB_0014c352;
    }
    iVar1 = pWith->nCte;
  }
  else {
    pCVar3 = pWith->a;
    for (lVar4 = 0; iVar1 = pWith->nCte, lVar4 < iVar1; lVar4 = lVar4 + 1) {
      iVar1 = sqlite3StrICmp(zLeft,pCVar3->zName);
      if (iVar1 == 0) {
        sqlite3ErrorMsg(pParse,"duplicate WITH table name: %s",zLeft);
      }
      pCVar3 = pCVar3 + 1;
    }
  }
  pWVar2 = (With *)sqlite3DbRealloc(db,pWith,(long)(iVar1 * 0x20 + 0x30));
LAB_0014c352:
  if (db->mallocFailed == '\0') {
    iVar1 = pWVar2->nCte;
    pWVar2->a[iVar1].pSelect = pQuery;
    pWVar2->a[iVar1].pCols = pArglist;
    pWVar2->a[iVar1].zName = zLeft;
    pWVar2->a[iVar1].zCteErr = (char *)0x0;
    pWVar2->nCte = iVar1 + 1;
  }
  else {
    sqlite3ExprListDelete(db,pArglist);
    sqlite3SelectDelete(db,pQuery);
    sqlite3DbFree(db,zLeft);
    pWVar2 = pWith;
  }
  return pWVar2;
}

Assistant:

SQLITE_PRIVATE With *sqlite3WithAdd(
  Parse *pParse,          /* Parsing context */
  With *pWith,            /* Existing WITH clause, or NULL */
  Token *pName,           /* Name of the common-table */
  ExprList *pArglist,     /* Optional column name list for the table */
  Select *pQuery          /* Query used to initialize the table */
){
  sqlite3 *db = pParse->db;
  With *pNew;
  char *zName;

  /* Check that the CTE name is unique within this WITH clause. If
  ** not, store an error in the Parse structure. */
  zName = sqlite3NameFromToken(pParse->db, pName);
  if( zName && pWith ){
    int i;
    for(i=0; i<pWith->nCte; i++){
      if( sqlite3StrICmp(zName, pWith->a[i].zName)==0 ){
        sqlite3ErrorMsg(pParse, "duplicate WITH table name: %s", zName);
      }
    }
  }

  if( pWith ){
    int nByte = sizeof(*pWith) + (sizeof(pWith->a[1]) * pWith->nCte);
    pNew = sqlite3DbRealloc(db, pWith, nByte);
  }else{
    pNew = sqlite3DbMallocZero(db, sizeof(*pWith));
  }
  assert( (pNew!=0 && zName!=0) || db->mallocFailed );

  if( db->mallocFailed ){
    sqlite3ExprListDelete(db, pArglist);
    sqlite3SelectDelete(db, pQuery);
    sqlite3DbFree(db, zName);
    pNew = pWith;
  }else{
    pNew->a[pNew->nCte].pSelect = pQuery;
    pNew->a[pNew->nCte].pCols = pArglist;
    pNew->a[pNew->nCte].zName = zName;
    pNew->a[pNew->nCte].zCteErr = 0;
    pNew->nCte++;
  }

  return pNew;
}